

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O3

int comex_accv(int datatype,void *scale,comex_giov_t *iov,int iov_len,int proc,comex_group_t group)

{
  int iVar1;
  long lVar2;
  int local_64;
  comex_giov_t *local_60;
  ulong local_58;
  ulong local_50;
  void **local_48;
  void **local_40;
  long local_38;
  
  if (0 < iov_len) {
    local_58 = (ulong)(uint)iov_len;
    local_50 = 0;
    local_60 = iov;
    do {
      local_38 = (long)local_60[local_50].count;
      if (0 < local_38) {
        local_40 = local_60[local_50].src;
        local_48 = local_60[local_50].dst;
        iVar1 = local_60[local_50].bytes;
        lVar2 = 0;
        do {
          local_64 = iVar1;
          comex_accs(datatype,scale,local_40[lVar2],(int *)0x0,local_48[lVar2],(int *)0x0,&local_64,
                     0,proc,group);
          lVar2 = lVar2 + 1;
        } while (local_38 != lVar2);
      }
      local_50 = local_50 + 1;
    } while (local_50 != local_58);
  }
  return 0;
}

Assistant:

int comex_accv(
        int datatype, void *scale,
        comex_giov_t *iov, int iov_len,
        int proc, comex_group_t group)
{
    int i;
    for (i=0; i<iov_len; ++i) {
        int j;
        void **src = iov[i].src;
        void **dst = iov[i].dst;
        int bytes = iov[i].bytes;
        int count = iov[i].count;
        for (j=0; j<count; ++j) {
            comex_acc(datatype, scale, src[j], dst[j], bytes, proc, group);
        }
    }
    return COMEX_SUCCESS;
}